

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall coins_tests::ccoins_serialization::test_method(ccoins_serialization *this)

{
  DataStream *pDVar1;
  int iVar2;
  uint uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  CScript *pCVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_std::byte> sp_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  Span<const_std::byte> sp_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  Span<const_std::byte> sp_02;
  const_string file_11;
  const_string file_12;
  Span<const_unsigned_char> s_03;
  Span<const_std::byte> sp_03;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar9;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  DataStream ss1;
  Wrapper<ScriptCompression,_CScript_&> local_240;
  Wrapper<AmountCompression,_long_&> local_238;
  char *local_230;
  DataStream ss5;
  undefined1 local_208 [24];
  assertion_result local_1f0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  undefined1 local_1b8 [36];
  uint local_194;
  uint local_190;
  undefined1 local_188 [24];
  undefined8 local_170;
  string local_168;
  undefined1 local_148 [8];
  undefined1 local_140 [28];
  uint local_124;
  uint local_120;
  undefined1 local_118 [72];
  __index_type local_d0;
  DataStream ss4;
  DataStream ss3;
  DataStream ss2;
  CTxOut local_68;
  uint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_118._16_2_ = 0xa5cf;
  local_118[0x12] = '\x7f';
  local_118[0x13] = ')';
  local_118._20_4_ = 0x7cf86bb3;
  local_118._24_2_ = 0x351d;
  local_118._0_8_ = 0x61810058833cf297;
  local_118[8] = '\x15';
  local_118[9] = 0x94;
  local_118[10] = 'N';
  local_118._11_5_ = 0x3c8e77f07;
  sp.m_size = 0x1a;
  sp.m_data = local_118;
  DataStream::DataStream(&ss1,sp);
  CTxOut::CTxOut(&local_68);
  local_40 = 0;
  local_40 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&ss1);
  local_118._0_8_ = &local_68;
  local_148 = (undefined1  [8])&local_68.scriptPubKey;
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (&ss1,(Wrapper<AmountCompression,_long_&> *)local_118,
             (Wrapper<ScriptCompression,_CScript_&> *)local_148);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x207;
  file.m_begin = (iterator)&local_270;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_280,msg);
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168._M_dataplus._M_p._0_4_ = local_40 & 1;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_168;
  local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(ss5.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (char)(uint)local_168._M_dataplus._M_p) ^ 1);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_66825c;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe73737;
  local_118[8] = '\0';
  local_118._0_8_ = &PTR__lazy_ostream_013ae108;
  local_118._16_2_ = 0x2138;
  local_118[0x12] = '<';
  local_118[0x13] = '\x01';
  local_118._20_4_ = 0;
  local_118._24_2_ = SUB82(&ss3,0);
  local_118[0x1a] = (undefined1)((ulong)&ss3 >> 0x10);
  local_118._27_5_ = (undefined5)((ulong)&ss3 >> 0x18);
  local_140[0] = '\0';
  local_148 = (undefined1  [8])&PTR__lazy_ostream_013ae3e8;
  local_140._8_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_140._16_8_ = &ss4;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_188;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss5,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe738b8,(size_t)&ss2,
             0x207,local_118,"false",local_148);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x208;
  file_00.m_begin = (iterator)&local_290;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2a0,
             msg_00);
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168._M_dataplus._M_p._0_4_ = local_40 >> 1;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ss5.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,local_40 >> 1 == 0x31cde);
  local_188._0_4_ = 0x31cde;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_66825c;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe73737;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_168;
  local_118[8] = '\0';
  local_118._0_8_ = &PTR__lazy_ostream_013ae108;
  local_118._16_2_ = 0x2138;
  local_118[0x12] = '<';
  local_118[0x13] = '\x01';
  local_118._20_4_ = 0;
  local_118._24_2_ = SUB82(&ss3,0);
  local_118[0x1a] = (undefined1)((ulong)&ss3 >> 0x10);
  local_118._27_5_ = (undefined5)((ulong)&ss3 >> 0x18);
  local_140[0] = '\0';
  local_148 = (undefined1  [8])&PTR__lazy_ostream_013ae108;
  local_140._8_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_140._16_8_ = &ss4;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_188;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss5,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe738c6,(size_t)&ss2,
             0x208,local_118,"203998U",local_148);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x209;
  file_01.m_begin = (iterator)&local_2b0;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c0,
             msg_01);
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168._M_dataplus._M_p = (pointer)0xdf8475800;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ss5.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_68.nValue == 60000000000);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_66825c;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe73737;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_68;
  local_118[8] = '\0';
  local_118._0_8_ = &PTR__lazy_ostream_013ae428;
  local_118._16_2_ = 0x2138;
  local_118[0x12] = '<';
  local_118[0x13] = '\x01';
  local_118._20_4_ = 0;
  local_118._24_2_ = SUB82(&ss3,0);
  local_118[0x1a] = (undefined1)((ulong)&ss3 >> 0x10);
  local_118._27_5_ = (undefined5)((ulong)&ss3 >> 0x18);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_168;
  local_140[0] = '\0';
  local_148 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
  local_140._8_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_140._16_8_ = &ss4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss5,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe738da,(size_t)&ss2,
             0x209,local_118,"CAmount{60000000000}",local_148);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x20a;
  file_02.m_begin = (iterator)&local_2d0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2e0,
             msg_02);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  uVar7 = &local_68.scriptPubKey;
  if (0x1c < local_68.scriptPubKey.super_CScriptBase._size) {
    uVar7 = local_68.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  uVar3 = local_68.scriptPubKey.super_CScriptBase._size - 0x1d;
  if (0x1c >= local_68.scriptPubKey.super_CScriptBase._size) {
    uVar3 = local_68.scriptPubKey.super_CScriptBase._size;
  }
  s.m_size._0_4_ = uVar3;
  s.m_data = (uchar *)uVar7;
  s.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&ss2,s);
  local_118._0_8_ = 0xe77f074e94156181;
  local_118[8] = 200;
  local_118[9] = '\x03';
  local_118[10] = 0xcf;
  local_118._11_5_ = 0x6bb3297fa5;
  local_118._16_2_ = 0x7cf8;
  local_118[0x12] = '\x1d';
  local_118[0x13] = '5';
  local_d0 = '\x02';
  GetScriptForDestination((CScript *)&ss4,(CTxDestination *)local_118);
  uVar3 = ss4.m_read_pos._4_4_ - 0x1d;
  pDVar1 = (DataStream *)
           ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ss4.m_read_pos._4_4_ < 0x1d) {
    uVar3 = ss4.m_read_pos._4_4_;
    pDVar1 = &ss4;
  }
  s_00.m_size._0_4_ = uVar3;
  s_00.m_data = (uchar *)pDVar1;
  s_00.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&ss3,s_00);
  if (ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar2 = bcmp(ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (size_t)ss2.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      bVar8 = iVar2 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  local_168._M_dataplus._M_p._0_1_ = bVar8;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_188._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
       + 0x5d;
  local_140._16_8_ = local_1d8;
  local_140[0] = '\0';
  local_148 = (undefined1  [8])&PTR__lazy_ostream_013ae148;
  local_140._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8._24_8_ = &local_1f0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1f0._0_8_ = (string *)&ss3;
  local_1d8._0_8_ = (string *)&ss2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)&ss5,1,2,REQUIRE,0xe738fe,
             (size_t)local_188,0x20a,local_148,
             "HexStr(GetScriptForDestination(PKHash(uint160(\"816115944e077fe7c803cfa57f29b36bf87c1d35\"_hex_u8))))"
             ,(lazy_ostream *)local_1b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  if ((pointer *)
      ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(ss3.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (0x1c < ss4.m_read_pos._4_4_) {
    free(ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start);
    ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_118);
  if ((pointer *)
      ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(ss2.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  local_118._16_2_ = 0x500f;
  local_118[0x12] = 0xaa;
  local_118[0x13] = 199;
  local_118._20_4_ = 0x957f7ef1;
  local_118._24_2_ = 0xca55;
  local_118[0x1a] = 0xa4;
  local_118._0_8_ = 0x8c0023d1bb77df8d;
  local_118[8] = 0x98;
  local_118[9] = 0x8f;
  local_118[10] = '\x1a';
  local_118._11_5_ = 0x1e16e24d4a;
  sp_00.m_size = 0x1b;
  sp_00.m_data = local_118;
  DataStream::DataStream(&ss2,sp_00);
  CTxOut::CTxOut((CTxOut *)local_148);
  local_120 = 0;
  local_120 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&ss2);
  local_118._0_8_ = local_148;
  local_1b8._0_8_ = (CScript *)(local_148 + 8);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (&ss2,(Wrapper<AmountCompression,_long_&> *)local_118,
             (Wrapper<ScriptCompression,_CScript_&> *)local_1b8);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x210;
  file_03.m_begin = (iterator)&local_2f0;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_300,
             msg_03);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8._0_8_ = CONCAT44(local_1d8._4_4_,local_120) & 0xffffffff00000001;
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(ss3.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,(char)local_120) &
                0xffffffffffffff01);
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_66825c;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe73737;
  local_168._M_dataplus._M_p = local_1d8;
  local_118[8] = '\0';
  local_118._0_8_ = &PTR__lazy_ostream_013ae108;
  local_118._16_2_ = 0x2138;
  local_118[0x12] = '<';
  local_118[0x13] = '\x01';
  local_118._20_4_ = 0;
  local_118._24_2_ = SUB82(&local_168,0);
  local_118[0x1a] = (undefined1)((ulong)&local_168 >> 0x10);
  local_118._27_5_ = (undefined5)((ulong)&local_168 >> 0x18);
  local_188._0_8_ = &local_1f0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae3e8;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1b8._24_8_ = local_188;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss3,(lazy_ostream *)&ss5,1,2,REQUIRE,0xe7397f,(size_t)&ss4,0x210,
             (Wrapper<AmountCompression,_long_&> *)local_118,"true",local_1b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x211;
  file_04.m_begin = (iterator)&local_310;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_320,
             msg_04);
  local_1b8._24_8_ = local_188;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ss3.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,local_120 >> 1 == 0x1d83b);
  local_1f0._0_4_ = 0x1d83b;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_66825c;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe73737;
  local_168._M_dataplus._M_p = local_1d8;
  local_118[8] = '\0';
  local_118._0_8_ = &PTR__lazy_ostream_013ae108;
  local_118._16_2_ = 0x2138;
  local_118[0x12] = '<';
  local_118[0x13] = '\x01';
  local_118._20_4_ = 0;
  local_118._24_2_ = SUB82(&local_168,0);
  local_118[0x1a] = (undefined1)((ulong)&local_168 >> 0x10);
  local_118._27_5_ = (undefined5)((ulong)&local_168 >> 0x18);
  local_188._0_8_ = &local_1f0;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1d8._0_4_ = local_120 >> 1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss3,(lazy_ostream *)&ss5,1,2,REQUIRE,0xe7398d,(size_t)&ss4,0x211,
             (Wrapper<AmountCompression,_long_&> *)local_118,"120891U",local_1b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x212;
  file_05.m_begin = (iterator)&local_330;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_340,
             msg_05);
  local_1b8._24_8_ = local_188;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8._0_4_ = 0x1af3d;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ss3.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_148 == (undefined1  [8])0x1af3d);
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_66825c;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe73737;
  local_168._M_dataplus._M_p = local_148;
  local_118[8] = '\0';
  local_118._0_8_ = &PTR__lazy_ostream_013ae428;
  local_118._16_2_ = 0x2138;
  local_118[0x12] = '<';
  local_118[0x13] = '\x01';
  local_118._20_4_ = 0;
  local_118._24_2_ = SUB82(&local_168,0);
  local_118[0x1a] = (undefined1)((ulong)&local_168 >> 0x10);
  local_118._27_5_ = (undefined5)((ulong)&local_168 >> 0x18);
  local_188._0_8_ = local_1d8;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss3,(lazy_ostream *)&ss5,1,2,REQUIRE,0xe739a1,(size_t)&ss4,0x212,
             (Wrapper<AmountCompression,_long_&> *)local_118,"110397",local_1b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x213;
  file_06.m_begin = (iterator)&local_350;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_360,
             msg_06);
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  pCVar6 = (CScript *)(local_148 + 8);
  if (0x1c < local_124) {
    pCVar6 = (CScript *)CONCAT71(local_140._1_7_,local_140[0]);
  }
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss3.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  uVar3 = local_124 - 0x1d;
  if (0x1c >= local_124) {
    uVar3 = local_124;
  }
  s_01.m_size._0_4_ = uVar3;
  s_01.m_data = (uchar *)pCVar6;
  s_01.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&ss4,s_01);
  local_118._0_8_ = 0x16e24d4a1a8f988c;
  local_118[8] = '\x1e';
  local_118[9] = '\x0f';
  local_118[10] = 'P';
  local_118._11_5_ = 0x7f7ef1c7aa;
  local_118._16_2_ = 0x5595;
  local_118[0x12] = 0xca;
  local_118[0x13] = 0xa4;
  local_d0 = '\x02';
  GetScriptForDestination((CScript *)local_188,(CTxDestination *)local_118);
  uVar3 = local_170._4_4_ - 0x1d;
  pCVar6 = (CScript *)local_188._0_8_;
  if (local_170._4_4_ < 0x1d) {
    uVar3 = local_170._4_4_;
    pCVar6 = (CScript *)local_188;
  }
  s_02.m_size._0_4_ = uVar3;
  s_02.m_data = (uchar *)pCVar6;
  s_02.m_size._4_4_ = 0;
  HexStr_abi_cxx11_(&local_168,s_02);
  if (ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)local_168._M_string_length) {
    if (ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar2 = bcmp(ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_start,local_168._M_dataplus._M_p,
                   (size_t)ss4.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      bVar8 = iVar2 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  local_1d8[0] = bVar8;
  local_1d8._8_8_ = 0;
  aStack_1c8._M_allocated_capacity = 0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1f0.m_message.px = (element_type *)0xe73737;
  local_1b8._24_8_ = local_208 + 8;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (size_type)local_208;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae148;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_208._0_8_ = &local_168;
  local_208._8_8_ = (string *)&ss4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&ss3,1,2,REQUIRE,0xe739b7,
             (size_t)&local_1f0,0x213,local_1b8,
             "HexStr(GetScriptForDestination(PKHash(uint160(\"8c988f1a4a4de2161e0f50aac7f17e7f9555caa4\"_hex_u8))))"
             ,&ss5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d8 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (0x1c < local_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ = (CScript *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_118);
  if ((pointer *)
      ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(ss4.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  local_118._0_3_ = 0x60000;
  sp_01.m_size = 3;
  sp_01.m_data = local_118;
  DataStream::DataStream(&ss3,sp_01);
  CTxOut::CTxOut((CTxOut *)local_118);
  local_118._40_4_ = 0;
  local_118._40_4_ = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&ss3);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_118 + 8;
  local_1b8._0_8_ = local_118;
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (&ss3,(Wrapper<AmountCompression,_long_&> *)local_1b8,
             (Wrapper<ScriptCompression,_CScript_&> *)&ss5);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x219;
  file_07.m_begin = (iterator)&local_370;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_380,
             msg_07);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss4.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208._8_8_ = CONCAT44(local_208._12_4_,local_118._40_4_) & 0xffffffff00000001;
  local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
  local_168._M_dataplus._M_p =
       (pointer)(CONCAT71(local_168._M_dataplus._M_p._1_7_,(char)local_118._40_4_) &
                 0xffffffffffffff01 ^ 1);
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_188._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
       + 0x5d;
  local_1d8._0_8_ = local_208 + 8;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1f0._0_8_ = local_208;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae3e8;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (size_type)&local_1f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1b8._24_8_ = (assertion_result *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)&ss4,1,2,REQUIRE,0xe73a38,
             (size_t)local_188,0x219,(Wrapper<AmountCompression,_long_&> *)local_1b8,"false",&ss5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x21a;
  file_08.m_begin = (iterator)&local_390;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3a0,
             msg_08);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss4.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_188._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
       + 0x5d;
  local_1d8._0_8_ = local_208 + 8;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1f0._0_8_ = local_208;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae108;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (size_type)&local_1f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1b8._24_8_ = (assertion_result *)local_1d8;
  local_168._M_dataplus._M_p._0_1_ = (uint)local_118._40_4_ < 2;
  local_208._8_4_ = (uint)local_118._40_4_ >> 1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)&ss4,1,2,REQUIRE,0xe73a46,
             (size_t)local_188,0x21a,(Wrapper<AmountCompression,_long_&> *)local_1b8,"0U",&ss5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x21b;
  file_09.m_begin = (iterator)&local_3b0;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3c0,
             msg_09);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss4.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168._M_dataplus._M_p._0_1_ = (long *)local_118._0_8_ == (long *)0x0;
  local_208._8_4_ = 0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_188._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
       + 0x5d;
  local_1d8._0_8_ = local_118;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1f0._0_8_ = local_208 + 8;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (size_type)&local_1f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1b8._24_8_ = (assertion_result *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)&ss4,1,2,REQUIRE,0xe73a52,
             (size_t)local_188,0x21b,(Wrapper<AmountCompression,_long_&> *)local_1b8,"0",&ss5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x21c;
  file_10.m_begin = (iterator)&local_3d0;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e0,
             msg_10);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss4.m_read_pos = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208._8_4_ = local_118._36_4_ - 0x1d;
  if ((uint)local_118._36_4_ < 0x1d) {
    local_208._8_4_ = local_118._36_4_;
  }
  local_168._M_dataplus._M_p._0_1_ = local_208._8_4_ == 0;
  local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_188._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
       + 0x5d;
  local_1d8._0_8_ = local_208 + 8;
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1f0._0_8_ = local_208;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae108;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (size_type)&local_1f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1b8._24_8_ = (assertion_result *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)&ss4,1,2,REQUIRE,0xe73a61,
             (size_t)local_188,0x21c,(Wrapper<AmountCompression,_long_&> *)local_1b8,"0U",&ss5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  local_1b8._0_3_ = 0x70000;
  sp_02.m_size = 3;
  sp_02.m_data = local_1b8;
  DataStream::DataStream(&ss4,sp_02);
  CTxOut::CTxOut((CTxOut *)local_1b8);
  local_190 = 0;
  local_190 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&ss4);
  local_240.m_object = (CScript *)(local_1b8 + 8);
  local_238.m_object = (long *)local_1b8;
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (&ss4,&local_238,&local_240);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar9 = 0x31fa7e;
  file_11.m_end = (iterator)0x223;
  file_11.m_begin = (iterator)&local_3f0;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_400,
             msg_11);
  local_168._M_dataplus._M_p = (pointer)((ulong)local_168._M_dataplus._M_p._1_7_ << 8);
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013af6b0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  ss5.m_read_pos = (size_type)anon_var_dwarf_67a81d;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_408 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)&ss5,1,1,WARN,_cVar9,(size_t)&local_410,
             0x223);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  if (0x1c < local_194) {
    free((void *)CONCAT71(local_1b8._9_7_,local_1b8[8]));
  }
  local_168.field_2._M_allocated_capacity = 0;
  local_168.field_2._8_8_ = 0;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_long>((DataStream *)&local_168,3000000000);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x22b;
  file_12.m_begin = (iterator)&local_420;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_430,
             msg_12);
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  s_03.m_data = (uchar *)(local_168._M_dataplus._M_p + local_168.field_2._8_8_);
  s_03.m_size = local_168._M_string_length - (long)s_03.m_data;
  HexStr_abi_cxx11_((string *)local_1d8,s_03);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_1d8,"8a95c0bb00");
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_208._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_208._16_8_ = "";
  local_1b8[8] = false;
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8._24_8_ = local_208;
  ss5.m_read_pos = (size_type)&local_230;
  local_230 = "8a95c0bb00";
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013af6f0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_208._0_8_ = (string *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,(lazy_ostream *)local_188,1,2,REQUIRE,0xe73a93,(size_t)(local_208 + 8),0x22b
             ,(CTxOut *)local_1b8,"\"8a95c0bb00\"",&ss5);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_,aStack_1c8._M_allocated_capacity + 1);
  }
  local_1b8._6_2_ = SUB82(local_1b8._0_8_,6) & 0xff00;
  local_1b8._0_6_ = 0xbbc000000000;
  local_1b8._0_4_ = 0x958a0000;
  sp_03.m_size = 7;
  sp_03.m_data = local_1b8;
  DataStream::DataStream(&ss5,sp_03);
  CTxOut::CTxOut((CTxOut *)local_1b8);
  local_190 = 0;
  local_190 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&ss5);
  local_1d8._0_8_ = local_1b8 + 8;
  local_188._0_8_ = (CTxOut *)local_1b8;
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (&ss5,(Wrapper<AmountCompression,_long_&> *)local_188,
             (Wrapper<ScriptCompression,_CScript_&> *)local_1d8);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar9 = 0x31fd76;
  file_13.m_end = (iterator)0x230;
  file_13.m_begin = (iterator)&local_440;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_450,
             msg_13);
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
  local_1d8._8_8_ = 0;
  aStack_1c8._M_allocated_capacity = 0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013af6b0;
  local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_170 = "We should have thrown";
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_458 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_188,1,1,WARN,_cVar9,
             (size_t)&local_460,0x230);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d8 + 0x10));
  if (0x1c < local_194) {
    free((void *)CONCAT71(local_1b8._9_7_,local_1b8[8]));
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss5);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_168);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss4);
  if (0x1c < (uint)local_118._36_4_) {
    free((void *)CONCAT53(local_118._11_5_,
                          CONCAT12(local_118[10],CONCAT11(local_118[9],local_118[8]))));
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss3);
  if (0x1c < local_124) {
    free((void *)CONCAT71(local_140._1_7_,local_140[0]));
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss2);
  if (0x1c < local_68.scriptPubKey.super_CScriptBase._size) {
    free(local_68.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_serialization)
{
    // Good example
    DataStream ss1{"97f23c835800816115944e077fe7c803cfa57f29b36bf87c1d35"_hex};
    Coin cc1;
    ss1 >> cc1;
    BOOST_CHECK_EQUAL(cc1.fCoinBase, false);
    BOOST_CHECK_EQUAL(cc1.nHeight, 203998U);
    BOOST_CHECK_EQUAL(cc1.out.nValue, CAmount{60000000000});
    BOOST_CHECK_EQUAL(HexStr(cc1.out.scriptPubKey), HexStr(GetScriptForDestination(PKHash(uint160("816115944e077fe7c803cfa57f29b36bf87c1d35"_hex_u8)))));

    // Good example
    DataStream ss2{"8ddf77bbd123008c988f1a4a4de2161e0f50aac7f17e7f9555caa4"_hex};
    Coin cc2;
    ss2 >> cc2;
    BOOST_CHECK_EQUAL(cc2.fCoinBase, true);
    BOOST_CHECK_EQUAL(cc2.nHeight, 120891U);
    BOOST_CHECK_EQUAL(cc2.out.nValue, 110397);
    BOOST_CHECK_EQUAL(HexStr(cc2.out.scriptPubKey), HexStr(GetScriptForDestination(PKHash(uint160("8c988f1a4a4de2161e0f50aac7f17e7f9555caa4"_hex_u8)))));

    // Smallest possible example
    DataStream ss3{"000006"_hex};
    Coin cc3;
    ss3 >> cc3;
    BOOST_CHECK_EQUAL(cc3.fCoinBase, false);
    BOOST_CHECK_EQUAL(cc3.nHeight, 0U);
    BOOST_CHECK_EQUAL(cc3.out.nValue, 0);
    BOOST_CHECK_EQUAL(cc3.out.scriptPubKey.size(), 0U);

    // scriptPubKey that ends beyond the end of the stream
    DataStream ss4{"000007"_hex};
    try {
        Coin cc4;
        ss4 >> cc4;
        BOOST_CHECK_MESSAGE(false, "We should have thrown");
    } catch (const std::ios_base::failure&) {
    }

    // Very large scriptPubKey (3*10^9 bytes) past the end of the stream
    DataStream tmp{};
    uint64_t x = 3000000000ULL;
    tmp << VARINT(x);
    BOOST_CHECK_EQUAL(HexStr(tmp), "8a95c0bb00");
    DataStream ss5{"00008a95c0bb00"_hex};
    try {
        Coin cc5;
        ss5 >> cc5;
        BOOST_CHECK_MESSAGE(false, "We should have thrown");
    } catch (const std::ios_base::failure&) {
    }
}